

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O1

ps_seg_t * allphone_search_seg_next(ps_seg_t *seg)

{
  ps_segfuncs_t *ppVar1;
  _func_ps_seg_t_ptr_ps_seg_t_ptr *p_Var2;
  char *pcVar3;
  
  ppVar1 = (ps_segfuncs_t *)(seg[1].vt)->seg_free;
  seg[1].vt = ppVar1;
  if (ppVar1 == (ps_segfuncs_t *)0x0) {
    ckd_free(seg);
    seg = (ps_seg_t *)0x0;
  }
  else {
    p_Var2 = ppVar1->seg_next;
    seg->sf = *(frame_idx_t *)(p_Var2 + 4);
    seg->ef = *(frame_idx_t *)(p_Var2 + 8);
    seg->ascr = *(int32 *)(p_Var2 + 0xc);
    seg->lscr = *(int32 *)(p_Var2 + 0x10);
    pcVar3 = bin_mdef_ciphone_str(seg->search->acmod->mdef,(int)*(short *)p_Var2);
    seg->text = pcVar3;
    seg->wid = -1;
  }
  return seg;
}

Assistant:

static ps_seg_t *
allphone_search_seg_next(ps_seg_t * seg)
{
    phseg_iter_t *itor = (phseg_iter_t *) seg;
    phseg_t *phseg;

    itor->seg = itor->seg->next;
    
    if (itor->seg == NULL) {
	allphone_search_seg_free(seg);
        return NULL;
    }
    phseg = gnode_ptr(itor->seg);
    allphone_search_fill_iter(seg, phseg);

    return seg;
}